

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiInputFlags flags,ImGuiID owner_id)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  uint uVar5;
  double dVar6;
  float repeat_rate;
  float repeat_delay;
  float local_28;
  float local_24;
  
  pIVar4 = GetKeyData(key);
  if ((pIVar4->Down == true) && (fVar1 = pIVar4->DownDuration, 0.0 <= fVar1)) {
    uVar5 = (uint)((flags & 0xfeU) != 0);
    if ((uVar5 == 0 && (flags & 1U) == 0) || ((fVar1 == 0.0 && (!NAN(fVar1))))) {
      if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_00165269;
    }
    else {
      GetTypematicRepeatRate(uVar5 | flags,&local_24,&local_28);
      if (local_24 < fVar1) {
        iVar3 = GetKeyPressedAmount(key,local_24,local_28);
        if ((flags & 0xf0U) == 0 || iVar3 < 1) {
          if (0 < iVar3) goto LAB_00165269;
        }
        else {
          dVar6 = (GImGui->Time - (double)fVar1) + 9.999999747378752e-06;
          bVar2 = true;
          if (((flags & 0x20U) != 0) && (dVar6 < GImGui->LastKeyModsChangeTime)) {
            bVar2 = false;
          }
          if (((flags & 0x40U) != 0) && (dVar6 < GImGui->LastKeyModsChangeFromNoneTime)) {
            bVar2 = false;
          }
          if (((-1 < (char)flags) || (GImGui->LastKeyboardKeyPressTime <= dVar6)) && (bVar2)) {
LAB_00165269:
            bVar2 = TestKeyOwner(key,owner_id);
            return bVar2;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiInputFlags flags, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!
    if (flags & (ImGuiInputFlags_RepeatRateMask_ | ImGuiInputFlags_RepeatUntilMask_)) // Setting any _RepeatXXX option enables _Repeat
        flags |= ImGuiInputFlags_Repeat;

    bool pressed = (t == 0.0f);
    if (!pressed && (flags & ImGuiInputFlags_Repeat) != 0)
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
        if (pressed && (flags & ImGuiInputFlags_RepeatUntilMask_))
        {
            // Slightly bias 'key_pressed_time' as DownDuration is an accumulation of DeltaTime which we compare to an absolute time value.
            // Ideally we'd replace DownDuration with KeyPressedTime but it would break user's code.
            ImGuiContext& g = *GImGui;
            double key_pressed_time = g.Time - t + 0.00001f;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChange) && (g.LastKeyModsChangeTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilKeyModsChangeFromNone) && (g.LastKeyModsChangeFromNoneTime > key_pressed_time))
                pressed = false;
            if ((flags & ImGuiInputFlags_RepeatUntilOtherKeyPress) && (g.LastKeyboardKeyPressTime > key_pressed_time))
                pressed = false;
        }
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}